

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O0

type __thiscall
fmt::v5::internal::printf_width_handler<wchar_t>::operator()
          (printf_width_handler<wchar_t> *this,unsigned_long_long value)

{
  type_conflict4 tVar1;
  uint uVar2;
  format_error *this_00;
  unsigned_long_long in_RSI;
  long *in_RDI;
  uint int_max;
  UnsignedType width;
  char *in_stack_ffffffffffffffb8;
  ulong local_18;
  
  tVar1 = is_negative<unsigned_long_long>(in_RSI);
  local_18 = in_RSI;
  if (tVar1) {
    *(undefined4 *)(*in_RDI + 8) = 1;
    local_18 = -in_RSI;
  }
  uVar2 = std::numeric_limits<int>::max();
  if (local_18 <= uVar2) {
    return (type)local_18;
  }
  this_00 = (format_error *)__cxa_allocate_exception(0x10);
  format_error::format_error(this_00,in_stack_ffffffffffffffb8);
  __cxa_throw(this_00,&format_error::typeinfo,format_error::~format_error);
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, unsigned>::type
      operator()(T value) {
    typedef typename internal::int_traits<T>::main_type UnsignedType;
    UnsignedType width = static_cast<UnsignedType>(value);
    if (internal::is_negative(value)) {
      spec_.align_ = ALIGN_LEFT;
      width = 0 - width;
    }
    unsigned int_max = std::numeric_limits<int>::max();
    if (width > int_max)
      FMT_THROW(format_error("number is too big"));
    return static_cast<unsigned>(width);
  }